

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav * drwav_open_write(drwav_data_format *pFormat,drwav_write_proc onWrite,drwav_seek_proc onSeek,
                        void *pUserData)

{
  drwav_bool32 dVar1;
  drwav *pWav;
  void *pUserData_local;
  drwav_seek_proc onSeek_local;
  drwav_write_proc onWrite_local;
  drwav_data_format *pFormat_local;
  
  pFormat_local = (drwav_data_format *)malloc(0x150);
  if ((drwav *)pFormat_local == (drwav *)0x0) {
    pFormat_local = (drwav_data_format *)0x0;
  }
  else {
    dVar1 = drwav_init_write((drwav *)pFormat_local,pFormat,onWrite,onSeek,pUserData);
    if (dVar1 == 0) {
      free(pFormat_local);
      pFormat_local = (drwav_data_format *)0x0;
    }
  }
  return (drwav *)pFormat_local;
}

Assistant:

drwav* drwav_open_write(const drwav_data_format* pFormat, drwav_write_proc onWrite, drwav_seek_proc onSeek,
                        void* pUserData) {
    drwav* pWav = (drwav*)DRWAV_MALLOC(sizeof(*pWav));
    if (pWav == NULL) {
        return NULL;
    }

    if (!drwav_init_write(pWav, pFormat, onWrite, onSeek, pUserData)) {
        DRWAV_FREE(pWav);
        return NULL;
    }

    return pWav;
}